

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O2

ARKodeButcherTable ARKodeButcherTable_Copy(ARKodeButcherTable B)

{
  uint stages;
  realtype *prVar1;
  int iVar2;
  ARKodeButcherTable pAVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (B != (ARKodeButcherTable)0x0) {
    stages = B->stages;
    prVar1 = B->d;
    pAVar3 = ARKodeButcherTable_Alloc(stages,(uint)(prVar1 != (realtype *)0x0));
    uVar5 = 0;
    if (pAVar3 == (ARKodeButcherTable)0x0) {
      pAVar3 = (ARKodeButcherTable)0x0;
    }
    else {
      pAVar3->stages = B->stages;
      iVar2 = B->p;
      pAVar3->q = B->q;
      pAVar3->p = iVar2;
      uVar4 = 0;
      if (0 < (int)stages) {
        uVar4 = (ulong)stages;
      }
      for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
        pAVar3->c[uVar5] = B->c[uVar5];
        pAVar3->b[uVar5] = B->b[uVar5];
        for (uVar6 = 0; stages != uVar6; uVar6 = uVar6 + 1) {
          pAVar3->A[uVar5][uVar6] = B->A[uVar5][uVar6];
        }
      }
      if (prVar1 != (realtype *)0x0) {
        for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          pAVar3->d[uVar5] = B->d[uVar5];
        }
      }
    }
    return pAVar3;
  }
  return (ARKodeButcherTable)0x0;
}

Assistant:

ARKodeButcherTable ARKodeButcherTable_Copy(ARKodeButcherTable B)
{
  int i, j, s;
  ARKodeButcherTable Bcopy;
  booleantype embedded;

  /* Check for legal input */
  if (B == NULL) return(NULL);

  /* Get the number of stages */
  s = B->stages;

  /* Does the table have an embedding? */
  embedded = (B->d != NULL) ? SUNTRUE : SUNFALSE;

  /* Allocate Butcher table structure */
  Bcopy = ARKodeButcherTable_Alloc(s, embedded);
  if (Bcopy == NULL) return(NULL);

  /* set the relevant parameters */
  Bcopy->stages = B->stages;
  Bcopy->q = B->q;
  Bcopy->p = B->p;

  /* Copy Butcher table */
  for (i=0; i<s; i++) {
    Bcopy->c[i] = B->c[i];
    Bcopy->b[i] = B->b[i];
    for (j=0; j<s; j++) {
      Bcopy->A[i][j] = B->A[i][j];
    }
  }

  if (embedded)
    for (i=0; i<s; i++)
      Bcopy->d[i] = B->d[i];

  return(Bcopy);
}